

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,ResultType *rt)

{
  CWriter *this_00;
  Type *pTVar1;
  TypeVector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  string local_30;
  
  this_00 = (CWriter *)rt->types;
  pTVar1 = *(Type **)&this_00->field_0x0;
  if (pTVar1 == *(Type **)(this_00 + 8)) {
    WriteData(this,"void",4);
    return;
  }
  if ((long)*(Type **)(this_00 + 8) - (long)pTVar1 == 8) {
    Write(this,*pTVar1);
    return;
  }
  (anonymous_namespace)::CWriter::MangleMultivalueTypes_abi_cxx11_(&local_30,this_00,in_RDX);
  (anonymous_namespace)::CWriter::Write<char_const(&)[8],std::__cxx11::string>
            ((CWriter *)this,(char (*) [8])&local_30,u);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void CWriter::Write(const ResultType& rt) {
  if (rt.types.empty()) {
    Write("void");
  } else if (rt.types.size() == 1) {
    Write(rt.types[0]);
  } else {
    Write("struct ", MangleMultivalueTypes(rt.types));
  }
}